

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

lineiter_t * lineiter_next_plain(lineiter_t *li)

{
  size_t new_size;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  li->lineno = li->lineno + 1;
  pcVar2 = fgets(li->buf,li->bsiz,(FILE *)li->fh);
  pcVar4 = li->buf;
  if (pcVar2 == (char *)0x0) {
    ckd_free(pcVar4);
    ckd_free(li);
    li = (lineiter_t *)0x0;
  }
  else {
    sVar3 = strlen(pcVar4);
    iVar1 = (int)sVar3;
    li->len = iVar1;
    if ((li->bsiz + -1 <= iVar1) && (pcVar4[iVar1 + -1] != '\n')) {
      while( true ) {
        new_size = (long)li->bsiz * 2;
        li->bsiz = (int32)new_size;
        pcVar4 = (char *)__ckd_realloc__(li->buf,new_size,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                                         ,0x149);
        li->buf = pcVar4;
        pcVar2 = fgets(pcVar4 + li->len,li->bsiz - li->len,(FILE *)li->fh);
        pcVar4 = li->buf;
        iVar1 = li->len;
        sVar3 = strlen(pcVar4 + iVar1);
        iVar1 = (int)sVar3 + iVar1;
        li->len = iVar1;
        if (pcVar2 == (char *)0x0) break;
        if (iVar1 < li->bsiz + -1) {
          return li;
        }
        if (pcVar4[(long)iVar1 + -1] == '\n') {
          return li;
        }
      }
    }
  }
  return li;
}

Assistant:

static lineiter_t *
lineiter_next_plain(lineiter_t *li)
{
    /* We are reading the next line */
    li->lineno++;
    
    /* Read a line and check for EOF. */
    if (fgets(li->buf, li->bsiz, li->fh) == NULL) {
        lineiter_free(li);
        return NULL;
    }
    /* If we managed to read the whole thing, then we are done
     * (this will be by far the most common result). */
    li->len = (int32)strlen(li->buf);
    if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
        return li;

    /* Otherwise we have to reallocate and keep going. */
    while (1) {
        li->bsiz *= 2;
        li->buf = (char *)ckd_realloc(li->buf, li->bsiz);
        /* If we get an EOF, we are obviously done. */
        if (fgets(li->buf + li->len, li->bsiz - li->len, li->fh) == NULL) {
            li->len += strlen(li->buf + li->len);
            return li;
        }
        li->len += strlen(li->buf + li->len);
        /* If we managed to read the whole thing, then we are done. */
        if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
            return li;
    }

    /* Shouldn't get here. */
    return li;
}